

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Biquad.cpp
# Opt level: O3

void __thiscall Iir::BiquadPoleState::BiquadPoleState(BiquadPoleState *this,Biquad *s)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  invalid_argument *this_00;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  
  *(undefined8 *)(this->super_PoleZeroPair).zeros.super_complex_pair_t.second._M_value = 0;
  *(undefined8 *)((this->super_PoleZeroPair).zeros.super_complex_pair_t.second._M_value + 8) = 0;
  *(undefined8 *)(this->super_PoleZeroPair).zeros.super_complex_pair_t.first._M_value = 0;
  *(undefined8 *)((this->super_PoleZeroPair).zeros.super_complex_pair_t.first._M_value + 8) = 0;
  *(undefined8 *)(this->super_PoleZeroPair).poles.super_complex_pair_t.second._M_value = 0;
  *(undefined8 *)((this->super_PoleZeroPair).poles.super_complex_pair_t.second._M_value + 8) = 0;
  *(undefined8 *)(this->super_PoleZeroPair).poles.super_complex_pair_t.first._M_value = 0;
  *(undefined8 *)((this->super_PoleZeroPair).poles.super_complex_pair_t.first._M_value + 8) = 0;
  this->gain = 1.0;
  dVar1 = s->m_a0;
  dVar16 = s->m_a1 * dVar1;
  dVar4 = s->m_a2 * dVar1;
  dVar14 = s->m_b0 * dVar1;
  dVar10 = s->m_b1 * dVar1;
  dVar15 = s->m_b2 * dVar1;
  if ((((dVar4 == 0.0) && (!NAN(dVar4))) && (dVar15 == 0.0)) && (!NAN(dVar15))) {
    *(double *)(this->super_PoleZeroPair).poles.super_complex_pair_t.first._M_value = -dVar16;
    *(undefined8 *)((this->super_PoleZeroPair).poles.super_complex_pair_t.first._M_value + 8) = 0;
    *(double *)(this->super_PoleZeroPair).zeros.super_complex_pair_t.first._M_value =
         -dVar14 / dVar10;
    *(undefined8 *)(this->super_PoleZeroPair).poles.super_complex_pair_t.second._M_value = 0;
    *(undefined8 *)((this->super_PoleZeroPair).poles.super_complex_pair_t.second._M_value + 8) = 0;
    *(undefined8 *)((this->super_PoleZeroPair).zeros.super_complex_pair_t.first._M_value + 8) = 0;
    *(undefined8 *)(this->super_PoleZeroPair).zeros.super_complex_pair_t.second._M_value = 0;
    *(undefined8 *)((this->super_PoleZeroPair).zeros.super_complex_pair_t.second._M_value + 8) = 0;
LAB_00101a60:
    this->gain = dVar14 / dVar1;
    return;
  }
  uVar8 = 0;
  dVar4 = csqrt(dVar16 * dVar16 + dVar1 * -4.0 * dVar4);
  auVar11._0_8_ = -(dVar16 + dVar4);
  auVar11._8_8_ = uVar8 ^ 0x8000000000000000;
  dVar9 = dVar1 + dVar1;
  auVar6._8_8_ = dVar9;
  auVar6._0_8_ = dVar9;
  auVar11 = divpd(auVar11,auVar6);
  *(undefined1 (*) [16])(this->super_PoleZeroPair).poles.super_complex_pair_t.first._M_value =
       auVar11;
  auVar5._0_8_ = dVar4 - dVar16;
  auVar5._8_8_ = uVar8;
  auVar13._8_8_ = dVar9;
  auVar13._0_8_ = dVar9;
  auVar6 = divpd(auVar5,auVar13);
  *(undefined1 (*) [16])(this->super_PoleZeroPair).poles.super_complex_pair_t.second._M_value =
       auVar6;
  if ((NAN(auVar11._0_8_) || NAN(auVar11._8_8_)) || (NAN(auVar6._0_8_) || NAN(auVar6._8_8_))) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"poles are NaN");
  }
  else {
    uVar8 = 0;
    dVar4 = csqrt(dVar10 * dVar10 + dVar14 * -4.0 * dVar15);
    auVar12._0_8_ = -(dVar10 + dVar4);
    auVar12._8_8_ = uVar8 ^ 0x8000000000000000;
    dVar15 = dVar14 + dVar14;
    auVar2._8_8_ = dVar15;
    auVar2._0_8_ = dVar15;
    auVar13 = divpd(auVar12,auVar2);
    *(undefined1 (*) [16])(this->super_PoleZeroPair).zeros.super_complex_pair_t.first._M_value =
         auVar13;
    auVar7._0_8_ = dVar4 - dVar10;
    auVar7._8_8_ = uVar8;
    auVar3._8_8_ = dVar15;
    auVar3._0_8_ = dVar15;
    auVar6 = divpd(auVar7,auVar3);
    *(undefined1 (*) [16])(this->super_PoleZeroPair).zeros.super_complex_pair_t.second._M_value =
         auVar6;
    if ((!NAN(auVar13._0_8_) && !NAN(auVar13._8_8_)) && (!NAN(auVar6._0_8_) && !NAN(auVar6._8_8_)))
    goto LAB_00101a60;
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"zeros are NaN");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

BiquadPoleState::BiquadPoleState (const Biquad& s)
	{
		const double a0 = s.getA0 ();
		const double a1 = s.getA1 ();
		const double a2 = s.getA2 ();
		const double b0 = s.getB0 ();
		const double b1 = s.getB1 ();
		const double b2 = s.getB2 ();

		if (a2 == 0 && b2 == 0)
		{
			// single pole
			poles.first = -a1;
			zeros.first = -b0 / b1;
			poles.second = 0;
			zeros.second = 0;
		}
		else
		{
			{
				const complex_t c = sqrt (complex_t (a1 * a1 - 4 * a0 * a2, 0));
				double d = 2. * a0;
				poles.first = -(a1 + c) / d;
				poles.second =  (c - a1) / d;
				if (poles.is_nan()) throw_invalid_argument("poles are NaN");
			}

			{
				const complex_t c = sqrt (complex_t (
								  b1 * b1 - 4 * b0 * b2, 0));
				double d = 2. * b0;
				zeros.first = -(b1 + c) / d;
				zeros.second =  (c - b1) / d;
				if (zeros.is_nan()) throw_invalid_argument("zeros are NaN");
			}
		}

		gain = b0 / a0;
	}